

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O2

Type __thiscall wasm::ParamInfo::getValueType(ParamInfo *this,Module *module)

{
  __index_type _Var1;
  Function *pFVar2;
  Type *this_00;
  Type local_18;
  
  _Var1 = *(__index_type *)
           ((long)&(this->values).
                   super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                   .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> + 0x38);
  if (_Var1 == '\x01') {
    pFVar2 = Module::getFunction(module,(Name)(*(IString **)
                                                &(this->values).
                                                 super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                                                 .
                                                 super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>
                                                 .
                                                 super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>
                                                 .
                                                 super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>
                                                 .
                                                 super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>
                                                 .
                                                 super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>
                                              )->str);
    this_00 = &local_18;
    wasm::Type::Type(this_00,(HeapType)(pFVar2->type).id,NonNullable,Inexact);
  }
  else {
    if (_Var1 != '\0') {
      handle_unreachable("unexpected const value type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                         ,0x7c);
    }
    this_00 = (Type *)((long)&(this->values).
                              super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                              .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>
                      + 0x18);
  }
  return (Type)this_00->id;
}

Assistant:

Type getValueType(Module* module) const {
    if (const auto literals = std::get_if<Literals>(&values)) {
      return (*literals)[0].type;
    } else if (auto callees = std::get_if<std::vector<Name>>(&values)) {
      auto* callee = module->getFunction((*callees)[0]);
      return Type(callee->type, NonNullable);
    } else {
      WASM_UNREACHABLE("unexpected const value type");
    }
  }